

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstructCondense.cpp
# Opt level: O3

void __thiscall
TPZDohrSubstructCondense<float>::SolveSystemPhi(TPZDohrSubstructCondense<float> *this)

{
  TPZFMatrix<float> *this_00;
  float *pfVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  TPZFMatrix<float> rhs;
  TPZFMatrix<float> local_c0;
  
  uVar3 = (uint)(this->fCoarseNodes).fNElements;
  lVar6 = (long)(int)(this->fNEquations + uVar3);
  lVar5 = (long)(int)uVar3;
  local_c0.super_TPZMatrix<float>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_c0.super_TPZMatrix<float>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_c0.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0181dbe8;
  local_c0.fElem = (float *)0x0;
  local_c0.fGiven = (float *)0x0;
  local_c0.fSize = 0;
  local_c0.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow = lVar6;
  local_c0.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol = lVar5;
  TPZVec<int>::TPZVec(&local_c0.fPivot.super_TPZVec<int>,0);
  local_c0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_c0.fPivot.super_TPZVec<int>.fStore = local_c0.fPivot.fExtAlloc;
  local_c0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_c0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_c0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813d70;
  local_c0.fWork.fStore = (float *)0x0;
  local_c0.fWork.fNElements = 0;
  local_c0.fWork.fNAlloc = 0;
  uVar7 = lVar6 * lVar5;
  if (uVar7 != 0) {
    local_c0.fElem = (float *)operator_new__(-(ulong)(uVar7 >> 0x3e != 0) | uVar7 * 4);
    if (0 < (long)uVar7) {
      memset(local_c0.fElem,0,uVar7 * 4);
    }
  }
  if (0 < (int)uVar3) {
    uVar7 = 0;
    do {
      iVar4 = this->fNEquations + (int)uVar7;
      if (((iVar4 < 0) || (local_c0.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow <= iVar4)) ||
         (local_c0.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol <= (long)uVar7)) {
        TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      local_c0.fElem[local_c0.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow * uVar7 + (long)iVar4]
           = 1.0;
      uVar7 = uVar7 + 1;
    } while ((uVar3 & 0x7fffffff) != uVar7);
  }
  TPZMatRed<float,_TPZFMatrix<float>_>::SetF(((this->fMatRedComplete).fRef)->fPointer,&local_c0);
  this_00 = &this->fKCi;
  TPZFMatrix<float>::Resize(this_00,lVar5,lVar5);
  TPZMatRed<float,_TPZFMatrix<float>_>::U1(((this->fMatRedComplete).fRef)->fPointer,this_00);
  TPZMatRed<float,_TPZFMatrix<float>_>::UGlobal
            (((this->fMatRedComplete).fRef)->fPointer,this_00,&local_c0);
  if (0 < (int)uVar3) {
    lVar6 = (this->fKCi).super_TPZMatrix<float>.super_TPZBaseMatrix.fRow;
    uVar7 = 0;
    do {
      if ((lVar6 <= (long)uVar7) ||
         ((this->fKCi).super_TPZMatrix<float>.super_TPZBaseMatrix.fCol <= (long)uVar7)) {
        TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pfVar1 = (this->fKCi).fElem;
      pfVar1[lVar6 * uVar7 + uVar7] = pfVar1[lVar6 * uVar7 + uVar7] + 10.0;
      uVar8 = 0;
      do {
        lVar2 = (this->fKCi).super_TPZMatrix<float>.super_TPZBaseMatrix.fCol;
        if (lVar2 <= (long)uVar8 || lVar6 <= (long)uVar7) {
          TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if ((lVar6 <= (long)uVar7) || (lVar2 <= (long)uVar8)) {
          TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        pfVar1[lVar6 * uVar8 + uVar7] = -pfVar1[lVar6 * uVar8 + uVar7];
        uVar8 = uVar8 + 1;
      } while ((uVar3 & 0x7fffffff) != uVar8);
      if ((lVar6 <= (long)uVar7) ||
         ((this->fKCi).super_TPZMatrix<float>.super_TPZBaseMatrix.fCol <= (long)uVar7)) {
        TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      (this->fWeights).super_TPZVec<float>.fStore[(this->fCoarseNodes).fStore[uVar7]] =
           pfVar1[lVar6 * uVar7 + uVar7];
      uVar7 = uVar7 + 1;
    } while (uVar7 != (uVar3 & 0x7fffffff));
  }
  TPZFMatrix<float>::Resize(&this->fPhiC,(long)this->fNEquations,lVar5);
  iVar4 = this->fNEquations;
  if (0 < iVar4) {
    lVar5 = 0;
    do {
      if (0 < (int)uVar3) {
        uVar7 = 0;
        do {
          if ((local_c0.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow <= lVar5) ||
             (local_c0.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol <= (long)uVar7)) {
            TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar6 = (this->fPhiC).super_TPZMatrix<float>.super_TPZBaseMatrix.fRow;
          if ((lVar6 <= lVar5) ||
             ((this->fPhiC).super_TPZMatrix<float>.super_TPZBaseMatrix.fCol <= (long)uVar7)) {
            TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          (this->fPhiC).fElem[lVar6 * uVar7 + lVar5] =
               local_c0.fElem
               [local_c0.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow * uVar7 + lVar5];
          uVar7 = uVar7 + 1;
        } while ((uVar3 & 0x7fffffff) != uVar7);
        iVar4 = this->fNEquations;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < iVar4);
  }
  TPZFMatrix<float>::~TPZFMatrix(&local_c0);
  return;
}

Assistant:

void TPZDohrSubstructCondense<TVar>::SolveSystemPhi() {
	int ncoarse = fCoarseNodes.NElements();
	int i,j;
	TPZFMatrix<TVar> rhs(this->fNEquations+ncoarse,ncoarse,0.);
	for(i=0; i<ncoarse; i++)
	{
		rhs(fNEquations+i,i) = 1.;
	}
	fMatRedComplete->SetF(rhs);
	fKCi.Resize(ncoarse,ncoarse);
	fMatRedComplete->U1(fKCi);
	fMatRedComplete->UGlobal(fKCi,rhs);
	for(i=0; i<ncoarse; i++) 
	{
		fKCi(i,i) += 10.;
		for(j=0; j<ncoarse; j++)
		{
			fKCi(i,j) = -fKCi(i,j);
		}
		fWeights[fCoarseNodes[i]] = fKCi(i,i);
	}
	fPhiC.Resize(fNEquations,ncoarse);
	for(i=0; i<fNEquations; i++)
	{
		for(j=0; j<ncoarse; j++)
		{
			fPhiC(i,j) = rhs(i,j);
		}
	}
}